

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_query_decoder.c
# Opt level: O1

int pt_qry_cond_branch(pt_query_decoder *decoder,int *taken)

{
  pt_tnt_cache *cache;
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  bool bVar4;
  uint32_t uVar5;
  uint8_t uVar6;
  undefined7 uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  
  if (taken == (int *)0x0 || decoder == (pt_query_decoder *)0x0) {
    return -2;
  }
  cache = &decoder->tnt;
  iVar10 = pt_tnt_cache_query(cache);
  if (-1 < iVar10) goto LAB_00108315;
  if (iVar10 == -8) {
    uVar1 = (decoder->evdec).time.tsc;
    uVar2 = (decoder->evdec).time.base;
    uVar3 = (decoder->evdec).time.fc;
    uVar8 = (decoder->evdec).time.ctc;
    uVar9 = (decoder->evdec).time.ctc_cyc;
    uVar5 = (decoder->evdec).time.lost_cyc;
    uVar6 = (decoder->evdec).time.cbr;
    uVar7 = *(undefined7 *)&(decoder->evdec).time.field_0x29;
    (decoder->last_time).lost_mtc = (decoder->evdec).time.lost_mtc;
    (decoder->last_time).lost_cyc = uVar5;
    (decoder->last_time).cbr = uVar6;
    *(undefined7 *)&(decoder->last_time).field_0x29 = uVar7;
    (decoder->last_time).fc = uVar3;
    (decoder->last_time).ctc = uVar8;
    (decoder->last_time).ctc_cyc = uVar9;
    (decoder->last_time).tsc = uVar1;
    (decoder->last_time).base = uVar2;
    iVar11 = pt_qry_cache_tnt(decoder);
    if (iVar11 < 0) {
LAB_0010830a:
      iVar10 = -8;
      bVar4 = false;
    }
    else {
      iVar10 = pt_tnt_cache_query(cache);
      iVar11 = iVar10;
      if (iVar10 < 0) {
        if (iVar10 == -8) {
          iVar11 = decoder->status;
          if (-1 < iVar11) {
            iVar11 = -8;
          }
          goto LAB_0010830a;
        }
        bVar4 = false;
      }
      else {
        bVar4 = true;
      }
    }
  }
  else {
    bVar4 = false;
    iVar11 = iVar10;
  }
  if (!bVar4) {
    return iVar11;
  }
LAB_00108315:
  *taken = iVar10;
  iVar10 = pt_tnt_cache_is_empty(cache);
  if (iVar10 == 0) {
    uVar12 = 0;
  }
  else {
    uVar12 = 4;
    if (decoder->status != -7) {
      uVar12 = (uint)(((decoder->event).type & ~ptev_disabled) != ptev_tip);
    }
  }
  return uVar12;
}

Assistant:

int pt_qry_cond_branch(struct pt_query_decoder *decoder, int *taken)
{
	int query;

	if (!decoder || !taken)
		return -pte_invalid;

	query = pt_tnt_cache_query(&decoder->tnt);
	if (query < 0) {
		int errcode;

		if (query != -pte_bad_query)
			return query;

		/* If we ran out of TNT bits, check if the current event
		 * provides any.
		 *
		 * Preserve the time at the TNT event.
		 */
		decoder->last_time = decoder->evdec.time;

		errcode = pt_qry_cache_tnt(decoder);
		if (errcode < 0)
			return errcode;

		query = pt_tnt_cache_query(&decoder->tnt);
		if (query < 0) {
			if (query != -pte_bad_query)
				return query;

			/* Report any deferred event decode errors.
			 *
			 * We deferred them until we consumed the last TNT bit
			 * in our cache.
			 */
			errcode = decoder->status;
			if (errcode < 0)
				return errcode;

			return query;
		}
	}

	*taken = query;

	return pt_qry_status_flags(decoder);
}